

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jedi.cpp
# Opt level: O1

void refreshDisplay(void)

{
  uint8_t *puVar1;
  int y;
  int iVar2;
  byte *pbVar3;
  long lVar4;
  byte bVar5;
  byte bVar6;
  
  if (refreshDisplay::surface_handle == -1) {
    refreshDisplay::surface_handle = open("/dev/fb0",2);
    refreshDisplay::surface_buffer =
         (uint8_t *)mmap((void *)0x0,0x2000,3,1,refreshDisplay::surface_handle,0);
  }
  puVar1 = jedi_screen_buffer;
  iVar2 = 0;
  pbVar3 = refreshDisplay::surface_buffer;
  do {
    lVar4 = 0;
    do {
      bVar6 = (0x80 < puVar1[lVar4]) + 2;
      if (puVar1[lVar4 + 1] < 0x81) {
        bVar6 = 0x80 < puVar1[lVar4];
      }
      bVar5 = bVar6 + 4;
      if (puVar1[lVar4 + 2] < 0x81) {
        bVar5 = bVar6;
      }
      bVar6 = bVar5 | 8;
      if (puVar1[lVar4 + 3] < 0x81) {
        bVar6 = bVar5;
      }
      bVar5 = bVar6 | 0x10;
      if (puVar1[lVar4 + 4] < 0x81) {
        bVar5 = bVar6;
      }
      bVar6 = bVar5 | 0x20;
      if (puVar1[lVar4 + 5] < 0x81) {
        bVar6 = bVar5;
      }
      bVar5 = bVar6 | 0x40;
      if (puVar1[lVar4 + 6] < 0x81) {
        bVar5 = bVar6;
      }
      bVar6 = bVar5 | 0x80;
      if (puVar1[lVar4 + 7] < 0x81) {
        bVar6 = bVar5;
      }
      *pbVar3 = bVar6;
      pbVar3 = pbVar3 + 1;
      lVar4 = lVar4 + 8;
    } while ((int)lVar4 != 0x80);
    iVar2 = iVar2 + 1;
    puVar1 = puVar1 + lVar4;
  } while (iVar2 != 0x40);
  return;
}

Assistant:

static void refreshDisplay()
{
#ifdef USE_SDL
    SDL_Surface* screen = SDL_GetVideoSurface();
#ifdef DEBUG
    for(int x=0; x<NUMCOLS; x++)
    {
        for(int y=0; y<NUMLINES; y++)
        {
            int c = char_at_place(x, y);
            
            for(int _x=0; _x<4; _x++)
            {
                for(int _y=0; _y<6; _y++)
                {
                    int color = (font_data[c * 6 + _y] & (0x08>>_x)) ? 0x8080AF : 0x202020;
                    if (!(flags_at(x, y) & F_SEEN))
                        color /= 2;
                    SDL_Rect rect = {Sint16(128 * 5 + x * 4 * 2 + _x * 2), Sint16(y * 6 * 2 + _y * 2), 2, 2};
                    SDL_FillRect(screen, &rect, color);
                }
            }
        }
    }
#endif
    for(int x=0; x<DISPLAY_WIDTH; x++)
    {
        for(int y=0; y<DISPLAY_HEIGHT; y++)
        {
            int color = jedi_screen_buffer[x + y * DISPLAY_WIDTH] > 128 ? 0x8080AF : 0x202020;
            SDL_Rect rect = {Sint16(x * 5), Sint16(y * 5), 4, 4};
            SDL_FillRect(screen, &rect, color);
        }
    }
    SDL_Flip(screen);
#else
    static int surface_handle = -1;
    static uint8_t* surface_buffer;
    if (surface_handle == -1)
    {
        surface_handle = open("/dev/fb0", O_RDWR);
        surface_buffer = (uint8_t*)mmap(nullptr, DISPLAY_WIDTH * DISPLAY_HEIGHT, PROT_READ | PROT_WRITE, MAP_SHARED, surface_handle, 0);
    }

    uint8_t* src = jedi_screen_buffer;
    uint8_t* dst = surface_buffer;
    for(int y=0; y<DISPLAY_HEIGHT; y++)
    {
        for(int x=0; x<DISPLAY_WIDTH/8; x++)
        {
            uint8_t b = 0;
            if (*src++ > 128) b |= 0x01;
            if (*src++ > 128) b |= 0x02;
            if (*src++ > 128) b |= 0x04;
            if (*src++ > 128) b |= 0x08;
            if (*src++ > 128) b |= 0x10;
            if (*src++ > 128) b |= 0x20;
            if (*src++ > 128) b |= 0x40;
            if (*src++ > 128) b |= 0x80;
            *dst++ = b;
        }
    }
#endif
}